

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash_to_curve.cc
# Opt level: O0

int ec_hash_to_curve_p384_xmd_sha512_sswu_draft07
              (EC_GROUP *group,EC_JACOBIAN *out,uint8_t *dst,size_t dst_len,uint8_t *msg,
              size_t msg_len)

{
  int iVar1;
  EVP_MD *md;
  undefined1 local_d8 [8];
  EC_FELEM c2;
  EC_FELEM Z;
  size_t msg_len_local;
  uint8_t *msg_local;
  size_t dst_len_local;
  uint8_t *dst_local;
  EC_JACOBIAN *out_local;
  EC_GROUP *group_local;
  
  iVar1 = EC_GROUP_get_curve_name((EC_GROUP *)group);
  if (iVar1 == 0x2cb) {
    iVar1 = felem_from_u8(group,(EC_FELEM *)(c2.words + 8),'\f');
    if ((iVar1 != 0) &&
       (iVar1 = ec_felem_from_bytes(group,(EC_FELEM *)local_d8,kP384Sqrt12,0x30), iVar1 != 0)) {
      ec_felem_neg(group,(EC_FELEM *)(c2.words + 8),(EC_FELEM *)(c2.words + 8));
      md = EVP_sha512();
      iVar1 = hash_to_curve(group,(EVP_MD *)md,(EC_FELEM *)(c2.words + 8),(EC_FELEM *)local_d8,0xc0,
                            out,dst,dst_len,msg,msg_len);
      return iVar1;
    }
  }
  else {
    ERR_put_error(0xf,0,0x82,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/ec/hash_to_curve.cc"
                  ,0x1dc);
  }
  return 0;
}

Assistant:

int ec_hash_to_curve_p384_xmd_sha512_sswu_draft07(
    const EC_GROUP *group, EC_JACOBIAN *out, const uint8_t *dst, size_t dst_len,
    const uint8_t *msg, size_t msg_len) {
  // See section 8.3 of draft-irtf-cfrg-hash-to-curve-07.
  if (EC_GROUP_get_curve_name(group) != NID_secp384r1) {
    OPENSSL_PUT_ERROR(EC, EC_R_GROUP_MISMATCH);
    return 0;
  }

  // Z = -12, c2 = sqrt(12)
  EC_FELEM Z, c2;
  if (!felem_from_u8(group, &Z, 12) ||
      !ec_felem_from_bytes(group, &c2, kP384Sqrt12, sizeof(kP384Sqrt12))) {
    return 0;
  }
  ec_felem_neg(group, &Z, &Z);

  return hash_to_curve(group, EVP_sha512(), &Z, &c2, /*k=*/192, out, dst,
                       dst_len, msg, msg_len);
}